

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  BYTE **ppBVar1;
  U32 *pUVar2;
  byte bVar3;
  rawSeq *prVar4;
  ldmState_t *plVar5;
  uint uVar6;
  XXH64_hash_t XVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  byte bVar11;
  U32 UVar12;
  uint uVar13;
  uint uVar14;
  BYTE *pBVar15;
  ulong uVar16;
  BYTE *pBVar17;
  ldmEntry_t *plVar18;
  ldmEntry_t *plVar19;
  ulong uVar20;
  U32 UVar21;
  long lVar22;
  BYTE *pBVar23;
  BYTE *pBVar24;
  int iVar25;
  ulong uVar26;
  BYTE *pBVar27;
  ldmParams_t *plVar28;
  ulong uVar29;
  BYTE *pBVar30;
  ldmEntry_t **pplVar31;
  uint local_18c;
  uint local_16c;
  BYTE *local_168;
  BYTE *local_160;
  size_t local_158;
  ldmParams_t *local_150;
  BYTE *local_148;
  BYTE *local_140;
  ldmState_t *local_138;
  BYTE *local_130;
  ldmEntry_t *local_128;
  BYTE *local_120;
  ulong local_118;
  ulong local_110;
  uint local_108;
  uint local_104;
  long local_100;
  ulong local_f8;
  long local_f0;
  ldmMatchCandidate_t *local_e8;
  size_t local_e0;
  size_t local_d8;
  BYTE *local_d0;
  ldmEntry_t *local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  BYTE *local_a8;
  void *local_a0;
  size_t local_98;
  ulong local_90;
  BYTE *local_88;
  ldmEntry_t **local_80;
  size_t *local_78;
  long local_70;
  BYTE *local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ldmRollingHashState_t hashState;
  
  bVar11 = (byte)params->windowLog;
  iVar25 = 1 << (bVar11 & 0x1f);
  local_100 = ((srcSize >> 0x14) + 1) - (ulong)((srcSize & 0xfffff) == 0);
  bVar11 = bVar11 & 0x1f;
  local_108 = -2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11;
  local_a8 = (BYTE *)((long)src + srcSize);
  local_78 = ldmState->splitIndices;
  local_e8 = ldmState->matchCandidates;
  local_80 = &ldmState->matchCandidates[0].bucket;
  local_f0 = 0;
  local_f8 = 0;
  local_150 = params;
  local_138 = ldmState;
  local_a0 = src;
  local_98 = srcSize;
  do {
    plVar28 = local_150;
    if ((local_f0 == local_100) || (local_b0 = sequences->size, sequences->capacity <= local_b0)) {
      return 0;
    }
    pBVar24 = (BYTE *)((long)local_a0 + local_f0 * 0x100000);
    pBVar15 = pBVar24 + 0x100000;
    if (local_98 + local_f0 * -0x100000 < 0x100000) {
      pBVar15 = local_a8;
    }
    local_168 = (ldmState->window).base;
    uVar6 = (int)pBVar15 - (int)local_168;
    if (uVar6 < 0xe0000001) {
      UVar12 = ldmState->loadedDictEnd;
    }
    else {
      UVar12 = params->hashLog;
      uVar14 = ((int)pBVar24 - (int)local_168) + local_108;
      (ldmState->window).base = local_168 + uVar14;
      ppBVar1 = &(ldmState->window).dictBase;
      *ppBVar1 = *ppBVar1 + uVar14;
      uVar6 = (ldmState->window).dictLimit;
      uVar13 = (ldmState->window).lowLimit;
      UVar21 = uVar13 - uVar14;
      if (uVar13 < uVar14 || UVar21 == 0) {
        UVar21 = 1;
      }
      (ldmState->window).lowLimit = UVar21;
      UVar21 = uVar6 - uVar14;
      if (uVar6 < uVar14 || UVar21 == 0) {
        UVar21 = 1;
      }
      (ldmState->window).dictLimit = UVar21;
      pUVar2 = &(ldmState->window).nbOverflowCorrections;
      *pUVar2 = *pUVar2 + 1;
      plVar19 = ldmState->hashTable;
      for (lVar22 = 0; 1L << ((byte)UVar12 & 0x3f) != lVar22; lVar22 = lVar22 + 1) {
        uVar6 = plVar19[lVar22].offset;
        UVar21 = uVar6 - uVar14;
        if (uVar6 < uVar14) {
          UVar21 = 0;
        }
        plVar19[lVar22].offset = UVar21;
      }
      ldmState->loadedDictEnd = 0;
      local_168 = (ldmState->window).base;
      uVar6 = (int)pBVar15 - (int)local_168;
      UVar12 = 0;
    }
    if (UVar12 + iVar25 < uVar6) {
      uVar6 = uVar6 - iVar25;
      uVar13 = (ldmState->window).lowLimit;
      if (uVar13 < uVar6) {
        (ldmState->window).lowLimit = uVar6;
        uVar13 = uVar6;
      }
      uVar6 = (ldmState->window).dictLimit;
      if (uVar6 < uVar13) {
        (ldmState->window).dictLimit = uVar13;
        uVar6 = uVar13;
      }
      ldmState->loadedDictEnd = 0;
    }
    else {
      uVar6 = (ldmState->window).dictLimit;
      uVar13 = (ldmState->window).lowLimit;
    }
    bVar11 = (byte)params->bucketSizeLog;
    local_60 = 1L << (bVar11 & 0x3f);
    UVar12 = params->hashLog;
    uVar29 = (ulong)params->minMatchLength;
    if (uVar13 < uVar6) {
      local_140 = (ldmState->window).dictBase;
      local_18c = uVar13;
    }
    else {
      local_140 = (BYTE *)0x0;
      local_18c = uVar6;
    }
    local_90 = (long)pBVar15 - (long)pBVar24;
    if (local_90 < uVar29) {
LAB_005e4853:
      uVar29 = local_90 + local_f8;
    }
    else {
      local_120 = local_140 + local_18c;
      local_d0 = local_140 + uVar6;
      local_130 = local_168 + uVar6;
      local_160 = pBVar24 + local_90;
      lVar22 = local_90 - 8;
      ZSTD_ldm_gear_init(&hashState,local_150);
      local_70 = -uVar29;
      local_104 = ~(-1 << ((char)UVar12 - bVar11 & 0x1f));
      local_110 = uVar29;
      local_88 = pBVar24 + lVar22;
      for (pBVar23 = pBVar24 + uVar29; pBVar23 < local_88; pBVar23 = pBVar23 + local_158) {
        local_16c = 0;
        local_148 = pBVar23;
        local_158 = ZSTD_ldm_gear_feed(&hashState,pBVar23,(long)local_88 - (long)pBVar23,local_78,
                                       &local_16c);
        lVar22 = local_70;
        pBVar23 = local_148;
        local_c0 = (ulong)local_16c;
        pplVar31 = local_80;
        for (uVar29 = 0; plVar5 = local_138, local_c0 != uVar29; uVar29 = uVar29 + 1) {
          sVar8 = local_138->splitIndices[uVar29];
          XVar7 = XXH64(pBVar23 + sVar8 + lVar22,local_110,0);
          uVar14 = (uint)XVar7 & local_104;
          ((ldmMatchCandidate_t *)(pplVar31 + -2))->split = pBVar23 + sVar8 + lVar22;
          *(uint *)(pplVar31 + -1) = uVar14;
          *(U32 *)((long)pplVar31 + -4) = (U32)(XVar7 >> 0x20);
          *pplVar31 = plVar5->hashTable + ((ulong)uVar14 << ((byte)plVar28->bucketSizeLog & 0x3f));
          pplVar31 = pplVar31 + 3;
        }
        local_68 = local_148 + local_158;
        ldmState = local_138;
        pBVar17 = local_168;
        for (uVar29 = 0; pBVar23 = local_148, uVar29 != local_c0; uVar29 = uVar29 + 1) {
          pBVar23 = local_e8[uVar29].split;
          uVar16 = (ulong)local_e8[uVar29].checksum;
          uVar20 = (long)pBVar23 - (long)pBVar17;
          uVar26 = (ulong)local_e8[uVar29].hash;
          if (pBVar23 < pBVar24) {
LAB_005e4d81:
            bVar11 = (byte)plVar28->bucketSizeLog;
            pBVar23 = ldmState->bucketOffsets;
            bVar3 = pBVar23[uVar26];
            ldmState->hashTable[(uVar26 << (bVar11 & 0x3f)) + (ulong)bVar3] =
                 (ldmEntry_t)(uVar20 & 0xffffffff | uVar16 << 0x20);
            pBVar23[uVar26] = ~(byte)(-1 << (bVar11 & 0x1f)) & bVar3 + 1;
          }
          else {
            plVar19 = local_e8[uVar29].bucket;
            plVar18 = plVar19 + local_60;
            local_128 = (ldmEntry_t *)0x0;
            local_b8 = 0;
            local_e0 = 0;
            local_d8 = 0;
            local_118 = uVar16;
            local_c8 = plVar18;
            local_58 = (long)pBVar23 - (long)pBVar17;
            local_50 = (ulong)local_e8[uVar29].hash;
            local_48 = uVar29;
            for (; plVar19 < plVar18; plVar19 = plVar19 + 1) {
              if (plVar19->checksum == (U32)uVar16) {
                uVar14 = plVar19->offset;
                if (local_18c < uVar14) {
                  if (uVar13 < uVar6) {
                    pBVar27 = local_140;
                    pBVar30 = local_d0;
                    if (uVar6 <= uVar14) {
                      pBVar27 = pBVar17;
                      pBVar30 = local_160;
                    }
                    pBVar27 = pBVar27 + uVar14;
                    pBVar17 = pBVar23 + ((long)pBVar30 - (long)pBVar27);
                    if (pBVar15 <= pBVar23 + ((long)pBVar30 - (long)pBVar27)) {
                      pBVar17 = local_160;
                    }
                    sVar8 = ZSTD_count(pBVar23,pBVar27,pBVar17);
                    if (pBVar27 + sVar8 == pBVar30) {
                      sVar9 = ZSTD_count(pBVar23 + sVar8,local_130,local_160);
                      sVar8 = sVar8 + sVar9;
                    }
                    uVar16 = local_118;
                    pBVar17 = local_168;
                    if (local_110 <= sVar8) {
                      pBVar17 = local_120;
                      if (uVar6 <= uVar14) {
                        pBVar17 = local_130;
                      }
                      sVar9 = ZSTD_ldm_countBackwardsMatch(pBVar23,pBVar24,pBVar27,pBVar17);
                      if ((pBVar17 != local_120) && (pBVar27 + -sVar9 == pBVar17)) {
                        sVar10 = ZSTD_ldm_countBackwardsMatch
                                           (pBVar23 + -sVar9,pBVar24,local_d0,local_120);
                        sVar9 = sVar9 + sVar10;
                      }
LAB_005e4c55:
                      uVar16 = local_118;
                      pBVar17 = local_168;
                      if (local_b8 < sVar9 + sVar8) {
                        local_128 = plVar19;
                        local_e0 = sVar9;
                        local_d8 = sVar8;
                        local_b8 = sVar9 + sVar8;
                      }
                    }
                  }
                  else {
                    pBVar27 = pBVar17 + uVar14;
                    sVar8 = ZSTD_count(pBVar23,pBVar27,local_160);
                    uVar16 = local_118;
                    plVar18 = local_c8;
                    pBVar17 = local_168;
                    if (local_110 <= sVar8) {
                      sVar9 = ZSTD_ldm_countBackwardsMatch(pBVar23,pBVar24,pBVar27,local_130);
                      plVar18 = local_c8;
                      goto LAB_005e4c55;
                    }
                  }
                }
              }
            }
            ldmState = local_138;
            uVar20 = local_58;
            uVar29 = local_48;
            uVar26 = local_50;
            plVar28 = local_150;
            if (local_128 == (ldmEntry_t *)0x0) goto LAB_005e4d81;
            sVar8 = sequences->size;
            if (sVar8 == sequences->capacity) {
              return 0xffffffffffffffba;
            }
            prVar4 = sequences->seq;
            UVar12 = local_128->offset;
            prVar4[sVar8].litLength = ((int)pBVar23 - (int)local_e0) - (int)pBVar24;
            prVar4[sVar8].matchLength = (int)local_d8 + (int)local_e0;
            prVar4[sVar8].offset = (int)local_58 - UVar12;
            sequences->size = sVar8 + 1;
            bVar11 = (byte)local_150->bucketSizeLog;
            pBVar24 = local_138->bucketOffsets;
            bVar3 = pBVar24[local_50];
            local_138->hashTable[(local_50 << (bVar11 & 0x3f)) + (ulong)bVar3] =
                 (ldmEntry_t)(local_58 & 0xffffffff | uVar16 << 0x20);
            pBVar24[local_50] = ~(byte)(-1 << (bVar11 & 0x1f)) & bVar3 + 1;
            pBVar24 = pBVar23 + local_d8;
            if (local_68 < pBVar24) {
              pBVar23 = pBVar24 + -local_158;
              break;
            }
          }
        }
      }
      uVar29 = (long)pBVar15 - (long)pBVar24;
      if (0xffffffffffffff88 < uVar29) {
        return uVar29;
      }
      if (sequences->size <= local_b0) goto LAB_005e4853;
      pUVar2 = &sequences->seq[local_b0].litLength;
      *pUVar2 = *pUVar2 + (int)local_f8;
    }
    local_f0 = local_f0 + 1;
    params = plVar28;
    local_f8 = uVar29;
  } while( true );
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, 0, maxDist, ldmState->loadedDictEnd, chunkStart, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
            /* invalidate dictionaries on overflow correction */
            ldmState->loadedDictEnd = 0;
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         *
         * NOTE: Because of dictionaries + sequence splitting we MUST make sure
         * that any offset used is valid at the END of the sequence, since it may
         * be split into two sequences. This condition holds when using
         * ZSTD_window_enforceMaxDist(), but if we move to checking offsets
         * against maxDist directly, we'll have to carefully handle that case.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}